

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

timestamp_t
duckdb::TimeBucket::OriginTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,timestamp_t origin,ValidityMask *mask,idx_t idx)

{
  interval_t bucket_width_00;
  interval_t bucket_width_01;
  interval_t bucket_width_02;
  bool bVar1;
  BucketWidthType BVar2;
  NotImplementedException *this;
  timestamp_t in_RCX;
  undefined8 in_R8;
  BucketWidthType bucket_width_type;
  idx_t in_stack_ffffffffffffff18;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff20;
  allocator local_b9;
  string local_b8 [8];
  timestamp_t in_stack_ffffffffffffff50;
  timestamp_t in_stack_ffffffffffffff58;
  timestamp_t in_stack_ffffffffffffff60;
  timestamp_t in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  int64_t local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RCX);
  if (bVar1) {
    bucket_width_02.micros = in_RCX.value;
    bucket_width_02.months = (int)in_R8;
    bucket_width_02.days = (int)((ulong)in_R8 >> 0x20);
    BVar2 = ClassifyBucketWidthErrorThrow(bucket_width_02);
    if (BVar2 == CONVERTIBLE_TO_MICROS) {
      bucket_width_01.micros = in_stack_ffffffffffffff78;
      bucket_width_01.months = (int)in_stack_ffffffffffffff70;
      bucket_width_01.days = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      local_8 = (int64_t)OriginWidthConvertibleToMicrosTernaryOperator::
                         Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                   (bucket_width_01,in_stack_ffffffffffffff68,
                                    in_stack_ffffffffffffff60);
    }
    else {
      if (BVar2 != CONVERTIBLE_TO_MONTHS) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,"Bucket type not implemented for TIME_BUCKET",&local_b9);
        duckdb::NotImplementedException::NotImplementedException(this,local_b8);
        __cxa_throw(this,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      bucket_width_00.micros = in_RCX.value;
      bucket_width_00.months = (int)in_stack_ffffffffffffff60.value;
      bucket_width_00.days = (int)((ulong)in_stack_ffffffffffffff60.value >> 0x20);
      local_8 = (int64_t)OriginWidthConvertibleToMonthsTernaryOperator::
                         Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                   (bucket_width_00,in_stack_ffffffffffffff58,
                                    in_stack_ffffffffffffff50);
    }
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    memset(&local_8,0,8);
  }
  return (timestamp_t)local_8;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin, ValidityMask &mask, idx_t idx) {
			if (!Value::IsFinite(origin)) {
				mask.SetInvalid(idx);
				return TR();
			}
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OriginWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OriginWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}